

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

void __thiscall
cs_impl::any::holder<cs::type_t>::holder<cs::struct_builder_const&,cs::type_id_const&>
          (holder<cs::type_t> *this,struct_builder *args,type_id *args_1)

{
  function<cs_impl::any_()> fStack_38;
  
  (this->super_baseHolder)._vptr_baseHolder = (_func_int **)&PTR__holder_002409c0;
  std::function<cs_impl::any()>::function<cs::struct_builder_const&,void>
            ((function<cs_impl::any()> *)&fStack_38,args);
  cs::type_t::type_t(&this->mDat,&fStack_38,args_1);
  std::_Function_base::~_Function_base(&fStack_38.super__Function_base);
  return;
}

Assistant:

explicit holder(ArgsT &&...args):mDat(std::forward<ArgsT>(args)...) {}